

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ParseResult * read_object(ParseResult *__return_storage_ptr__,istream *is)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ast_type_t aVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long *plVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  char cVar11;
  char cVar12;
  _Alloc_hider _Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ParseResult result;
  string oct;
  string charname;
  parse_result_t local_140;
  element_type *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  char *local_128;
  size_type local_120;
  char local_118;
  undefined7 uStack_117;
  undefined8 uStack_110;
  undefined1 local_108 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  string local_c8;
  shared_ptr<ASTNode> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  element_type *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017a300;
  peVar1 = (element_type *)(p_Var6 + 1);
  *(undefined4 *)&p_Var6[1]._vptr__Sp_counted_base = 0;
  *(_Atomic_word **)&p_Var6[1]._M_use_count = &p_Var6[2]._M_use_count;
  p_Var6[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&p_Var6[2]._M_use_count = 0;
  p_Var6[3]._M_use_count = 0;
  p_Var6[3]._M_weak_count = 0;
  p_Var6[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var6[4]._vptr__Sp_counted_base = (_func_int **)&p_Var6[3]._M_use_count;
  *(_Atomic_word **)&p_Var6[3]._M_use_count = &p_Var6[3]._M_use_count;
  p_Var6[4]._M_use_count = 0;
  p_Var6[4]._M_weak_count = 0;
  local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var6;
  skip_whitespace(is);
  iVar3 = std::istream::get();
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  uVar14 = 0;
  uVar15 = 0;
  uVar16 = 0;
  uVar17 = 0;
  p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_128 = &local_118;
  local_120 = 0;
  local_118 = '\0';
  local_d0 = p_Var6;
  if (0x5a < iVar3) {
    if (iVar3 == 0x5b) goto switchD_0011ec73_caseD_28;
    if (iVar3 == 0x5d) goto switchD_0011ec73_caseD_29;
    if (iVar3 == 0x60) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"quasiquote","");
      read_quoted((ParseResult *)local_108,is,&local_a8,&local_c8);
      goto LAB_0011f026;
    }
    goto switchD_0011ec73_caseD_24;
  }
  switch(iVar3) {
  case 0x22:
    peVar1->type = STRING;
    local_78 = peVar1;
    iVar3 = std::istream::get();
    cVar11 = (char)p_Var6 + '\x18';
    do {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_108 + 0x10);
      if (iVar3 == 0x5c) {
        uVar4 = std::istream::get();
        if ((((uVar4 == 0x66) || (uVar4 == 0x6e)) || (uVar4 == 0x74)) ||
           ((uVar4 & 0xfffffff8) != 0x30)) goto LAB_0011ecb8;
        local_108._8_8_ = (element_type *)0x0;
        local_108._16_8_ = local_108._16_8_ & 0xffffffffffffff00;
        iVar3 = 1;
        bVar2 = false;
        local_108._0_8_ = paVar9;
        do {
          cVar12 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108;
          std::__cxx11::string::push_back(cVar12);
          uVar4 = std::istream::get();
          if ((uVar4 & 0xfffffff8) != 0x30) {
            std::operator+(&local_70,"Invalid escape sequence: \\",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108);
            plVar7 = (long *)std::__cxx11::string::_M_replace_aux
                                       ((ulong)&local_70,local_70._M_string_length,0,'\x01');
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            plVar8 = plVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar8) {
              local_c8.field_2._M_allocated_capacity = *plVar8;
              local_c8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *plVar8;
              local_c8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_c8._M_string_length = plVar7[1];
            *plVar7 = (long)plVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            ParseResult::ParseResult(__return_storage_ptr__,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,
                              (ulong)(local_c8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            break;
          }
          iVar3 = iVar3 + -1;
          bVar2 = iVar3 != 0;
        } while (iVar3 == 0);
        if (!bVar2) {
          uVar10 = local_108._16_8_;
          _Var13._M_p = (pointer)local_108._0_8_;
          if ((undefined1 *)local_108._0_8_ == local_108 + 0x10) goto LAB_0011f4db;
          goto LAB_0011efc1;
        }
        std::__cxx11::string::push_back(cVar12);
        std::__cxx11::string::push_back(cVar11);
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
      }
      else {
        if (iVar3 == -1) {
          local_108._0_8_ = paVar9;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"Unclosed string literal","");
          ParseResult::ParseResult(__return_storage_ptr__,(string *)local_108);
          uVar10 = local_108._16_8_;
          _Var13._M_p = (pointer)local_108._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._0_8_ == paVar9) goto LAB_0011f4db;
          goto LAB_0011efc1;
        }
        if (iVar3 == 0x22) goto LAB_0011f3e4;
LAB_0011ecb8:
        std::__cxx11::string::push_back(cVar11);
      }
      iVar3 = std::istream::get();
    } while( true );
  case 0x23:
    iVar3 = std::istream::get();
    iVar3 = tolower(iVar3);
    if (0x5b < iVar3) {
      if (iVar3 == 0x5c) {
        peVar1->type = CHAR;
        iVar3 = std::istream::get();
        if (iVar3 == -1) {
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"Invalid character","");
          ParseResult::ParseResult(__return_storage_ptr__,(string *)local_108);
        }
        else {
          local_98._M_string_length = 0;
          *local_98._M_dataplus._M_p = '\0';
          std::__cxx11::string::push_back((char)&local_98);
          iVar3 = std::istream::peek();
          while (bVar2 = is_delimiter(iVar3), !bVar2) {
            std::__cxx11::string::push_back((char)&local_98);
            std::istream::get();
            iVar3 = std::istream::peek();
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          normalize_char_name((string *)local_108,&local_50);
          std::__cxx11::string::operator=((string *)&p_Var6[1]._M_use_count,(string *)local_108);
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_d0[2]._vptr__Sp_counted_base != (_func_int **)0x0) {
            __return_storage_ptr__->result = OK;
            (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = peVar1;
            goto LAB_0011f406;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,"Invalid character: #\\",&local_98);
          ParseResult::ParseResult(__return_storage_ptr__,(string *)local_108);
        }
        goto LAB_0011efae;
      }
      if (iVar3 == 0x66) {
        *(undefined4 *)&local_d0[1]._vptr__Sp_counted_base = 5;
        std::__cxx11::string::operator=((string *)&p_Var6[1]._M_use_count,"f");
      }
      else {
        if (iVar3 != 0x74) goto LAB_0011f5ca;
        *(undefined4 *)&local_d0[1]._vptr__Sp_counted_base = 5;
        std::__cxx11::string::operator=((string *)&p_Var6[1]._M_use_count,"t");
      }
      goto LAB_0011f0c0;
    }
    if (iVar3 == 0x21) {
      std::__cxx11::string::operator=((string *)&p_Var6[1]._M_use_count,"#!");
      iVar3 = std::istream::get();
      goto switchD_0011ec73_caseD_24;
    }
    if ((iVar3 != 0x28) && (iVar3 != 0x5b)) {
LAB_0011f5ca:
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Invalid sequence: #","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_c8,(char)iVar3);
      ParseResult::ParseResult(__return_storage_ptr__,(string *)local_108);
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      uVar10 = local_c8.field_2._M_allocated_capacity;
      _Var13._M_p = local_c8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_0011f4db;
      goto LAB_0011efc1;
    }
    read_list((ParseResult *)local_108,is,&local_a8,iVar3 == 0x5b);
    p_Var6 = local_d0;
    uVar14 = local_108._0_4_;
    local_140 = local_108._0_4_;
    local_138 = (element_type *)local_108._8_8_;
    p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_;
    local_108._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_108._8_8_ = (element_type *)0x0;
    std::__cxx11::string::operator=((string *)&local_128,(string *)(local_108 + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._24_8_ != &local_e0) {
      operator_delete((void *)local_108._24_8_,local_e0._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_);
    }
    if (uVar14 != OK) goto LAB_0011f2f1;
    *(undefined4 *)&p_Var6[1]._vptr__Sp_counted_base = 7;
    local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->result = OK;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var6;
    break;
  case 0x27:
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"quote","");
    read_quoted((ParseResult *)local_108,is,&local_a8,&local_c8);
LAB_0011f026:
    local_140 = local_108._0_4_;
    local_138 = (element_type *)local_108._8_8_;
    p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_;
    local_108._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_108._8_8_ = (element_type *)0x0;
    std::__cxx11::string::operator=((string *)&local_128,(string *)(local_108 + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._24_8_ != &local_e0) {
      operator_delete((void *)local_108._24_8_,local_e0._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1))
      ;
    }
    goto LAB_0011f0a9;
  case 0x28:
switchD_0011ec73_caseD_28:
    read_list((ParseResult *)local_108,is,&local_a8,iVar3 == 0x5b);
    local_140 = local_108._0_4_;
    local_138 = (element_type *)local_108._8_8_;
    p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_;
    local_108._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_108._8_8_ = (element_type *)0x0;
    std::__cxx11::string::operator=((string *)&local_128,(string *)(local_108 + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._24_8_ != &local_e0) {
      operator_delete((void *)local_108._24_8_,local_e0._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_);
    }
LAB_0011f0a9:
    if (local_140 != OK) {
LAB_0011f2f1:
      p_Var6 = p_Stack_130;
      __return_storage_ptr__->result = local_140;
      (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_138;
      (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var6;
      paVar9 = &(__return_storage_ptr__->error).field_2;
      (__return_storage_ptr__->error)._M_dataplus._M_p = (pointer)paVar9;
      if (local_128 == &local_118) {
        paVar9->_M_allocated_capacity = CONCAT71(uStack_117,local_118);
        *(undefined8 *)((long)&(__return_storage_ptr__->error).field_2 + 8) = uStack_110;
      }
      else {
        (__return_storage_ptr__->error)._M_dataplus._M_p = local_128;
        (__return_storage_ptr__->error).field_2._M_allocated_capacity =
             CONCAT71(uStack_117,local_118);
      }
      (__return_storage_ptr__->error)._M_string_length = local_120;
      local_120 = 0;
      local_118 = '\0';
      local_128 = &local_118;
      goto LAB_0011f4db;
    }
LAB_0011f0c0:
    __return_storage_ptr__->result = OK;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
LAB_0011f406:
    local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_d0;
    break;
  case 0x29:
switchD_0011ec73_caseD_29:
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Invalid syntax","");
    ParseResult::ParseResult(__return_storage_ptr__,(string *)local_108);
LAB_0011efae:
    uVar10 = local_108._16_8_;
    _Var13._M_p = (pointer)local_108._0_8_;
    if ((undefined1 *)local_108._0_8_ == local_108 + 0x10) goto LAB_0011f4db;
LAB_0011efc1:
    operator_delete(_Var13._M_p,
                    (ulong)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10)->
                                   _vptr__Sp_counted_base + 1));
    goto LAB_0011f4db;
  case 0x2c:
    iVar3 = std::istream::peek();
    if (iVar3 == 0x40) {
      std::istream::get();
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"unquote-splicing","");
      read_quoted((ParseResult *)local_108,is,&local_a8,&local_c8);
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"unquote","");
      read_quoted((ParseResult *)local_108,is,&local_a8,&local_c8);
    }
    uVar14 = local_108._0_4_;
    local_140 = local_108._0_4_;
    local_138 = (element_type *)local_108._8_8_;
    p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_;
    local_108._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_108._8_8_ = (element_type *)0x0;
    std::__cxx11::string::operator=((string *)&local_128,(string *)(local_108 + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._24_8_ != &local_e0) {
      operator_delete((void *)local_108._24_8_,local_e0._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1))
      ;
    }
    if (uVar14 == OK) {
      uVar14 = local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_;
      uVar15 = local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
      uVar16 = local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _0_4_;
      uVar17 = local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _4_4_;
      local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __return_storage_ptr__->result = OK;
LAB_0011f42c:
      *(undefined4 *)
       &(__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = uVar14;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->node).
               super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = uVar15;
      *(undefined4 *)
       &(__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = uVar16;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->node).
               super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4) =
           uVar17;
      break;
    }
    goto LAB_0011f2f1;
  default:
    if (iVar3 == -1) {
      __return_storage_ptr__->result = END;
      goto LAB_0011f42c;
    }
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x2a:
  case 0x2b:
switchD_0011ec73_caseD_24:
    tolower(iVar3);
    cVar11 = (char)&p_Var6[1]._M_use_count;
    std::__cxx11::string::push_back(cVar11);
    iVar3 = std::istream::peek();
    while (bVar2 = is_delimiter(iVar3), !bVar2) {
      tolower(iVar3);
      std::__cxx11::string::push_back(cVar11);
      std::istream::get();
      iVar3 = std::istream::peek();
    }
    aVar5 = identifier_type((string *)&p_Var6[1]._M_use_count);
    *(ast_type_t *)&local_d0[1]._vptr__Sp_counted_base = aVar5;
    local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->result = OK;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_d0;
  }
  (__return_storage_ptr__->error)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).field_2;
  (__return_storage_ptr__->error)._M_string_length = 0;
  (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
LAB_0011f4db:
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  if (p_Stack_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if (local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
LAB_0011f3e4:
  __return_storage_ptr__->result = OK;
  (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_78;
  goto LAB_0011f406;
}

Assistant:

ParseResult read_object(std::istream &is)
{
    auto o = std::make_shared<ASTNode>();
    skip_whitespace(is);
    int c = is.get();
    std::string charname;
    ParseResult result;
    switch(c)
    {
        case EOF:
            return ParseResult();
        case ')':
        case ']':
            return ParseResult("Invalid syntax");
        case '"':
            o->type = ast_type_t::STRING;
            c = is.get();
            while(c != EOF && c != '"')
            {
                if(c == '\\')
                {
                    c = is.get();
                    if(c == 'n')
                        o->value.push_back('\n');
                    else if(c == 't')
                        o->value.push_back('\t');
                    else if(c == 'f')
                        o->value.push_back('\f');
                    else if('0' <= c && c <= '7')
                    {
                        std::string oct;
                        for(int i = 0; i < 2; ++i)
                        {
                            oct.push_back(c);
                            c = is.get();
                            if(!('0' <= c && c <= '7'))
                                return ParseResult("Invalid escape sequence: \\" + oct + char(c));
                        }
                        oct.push_back(c);
                        o->value.push_back(parse_oct_char(oct));
                    }
                    else
                        o->value.push_back(c);
                }
                else
                    o->value.push_back(c);
                c = is.get();
            }
            if(c == EOF)
                return ParseResult("Unclosed string literal");
            return o;
        case '(':
        case '[':
            if((result = read_list(is, o, c == '[')).result != parse_result_t::OK)
                return result;
            return o;
        case '\'':
            if((result = read_quoted(is, o, "quote")).result != parse_result_t::OK)
                return result;
            return o;
        case '`':
            if((result = read_quoted(is, o, "quasiquote")).result != parse_result_t::OK)
                return result;
            return o;
        case ',':
            if(is.peek() == '@')
            {
                is.get();
                if((result = read_quoted(is, o, "unquote-splicing")).result != parse_result_t::OK)
                    return result;
            }
            else
            {
                if((result = read_quoted(is, o, "unquote")).result != parse_result_t::OK)
                    return result;
            }
            return o;
        case '#':
            c = tolower(is.get());
            switch(c)
            {
                case 't':
                    o->type = ast_type_t::BOOL;
                    o->value = "t";
                    return o;
                case 'f':
                    o->type = ast_type_t::BOOL;
                    o->value = "f";
                    return o;
                case '\\':
                    o->type = ast_type_t::CHAR;
                    c = is.get();
                    if(c == EOF)
                        return ParseResult("Invalid character");
                    charname.clear();
                    charname.push_back(c);
                    c = is.peek();
                    while(!is_delimiter(c))
                    {
                        charname.push_back(c);
                        is.get();
                        c = is.peek();
                    }
                    o->value = normalize_char_name(charname);
                    if(o->value.empty())
                        return ParseResult("Invalid character: #\\" + charname);
                    return o;
                case '(':
                case '[':
                    if((result = read_list(is, o, c == '[')).result != parse_result_t::OK)
                        return result;
                    o->type = ast_type_t::VECTOR;
                    return o;
                case '!':
                    o->value = "#!";
                    c = is.get();
                    break;
                default:
                    return ParseResult(std::string("Invalid sequence: #") + char(c));
            }
        default:
            o->value.push_back(tolower(c));
            c = is.peek();
            while(!is_delimiter(c))
            {
                o->value.push_back(tolower(c));
                is.get();
                c = is.peek();
            }
            o->type = identifier_type(o->value);
            return o;
    }
}